

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O1

parser_error parse_ego_combat(parser *p)

{
  parser_error pVar1;
  void *pvVar2;
  random_conflict rVar3;
  random_conflict rVar4;
  random_conflict rVar5;
  
  rVar3 = parser_getrand(p,"th");
  rVar4 = parser_getrand(p,"td");
  rVar5 = parser_getrand(p,"ta");
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    pVar1 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    *(random_conflict *)((long)pvVar2 + 0x208) = rVar3;
    *(random_conflict *)((long)pvVar2 + 0x218) = rVar4;
    *(random_conflict *)((long)pvVar2 + 0x228) = rVar5;
    pVar1 = PARSE_ERROR_NONE;
  }
  return pVar1;
}

Assistant:

static enum parser_error parse_ego_combat(struct parser *p) {
	struct random th = parser_getrand(p, "th");
	struct random td = parser_getrand(p, "td");
	struct random ta = parser_getrand(p, "ta");
	struct ego_item *e = parser_priv(p);

	if (!e) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	e->to_h = th;
	e->to_d = td;
	e->to_a = ta;
	return PARSE_ERROR_NONE;
}